

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_c9;
  Coroutine co;
  string local_b0;
  VMStd vm;
  Coroutine local_38;
  
  squall::VMStd::VMStd(&vm,0x400);
  squall::VMStd::dofile(&vm,"coroutine.nut");
  std::__cxx11::string::string((string *)&local_b0,"bar",(allocator *)&co);
  squall::TableBase::co_call<int,int,int,int>
            (&local_38,
             (TableBase *)
             vm.super_VM.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_b0,1,2,3,4);
  squall::Coroutine::~Coroutine(&local_38);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"zot",&local_c9);
  squall::TableBase::co_call<>
            (&co,(TableBase *)
                 vm.super_VM.root_table_._M_t.
                 super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>
                 .super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  while( true ) {
    bVar1 = squall::Coroutine::suspended(&co);
    if (!bVar1) break;
    squall::Coroutine::resume(&co);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** zot result: ");
  iVar2 = squall::Coroutine::result<int>(&co);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  squall::Coroutine::~Coroutine(&co);
  std::__cxx11::string::string((string *)&local_b0,"baz",&local_c9);
  squall::TableBase::co_call<>
            (&co,(TableBase *)
                 vm.super_VM.root_table_._M_t.
                 super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>
                 .super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  while( true ) {
    bVar1 = squall::Coroutine::suspended(&co);
    if (!bVar1) break;
    iVar2 = squall::Coroutine::yielded<int>(&co);
    poVar3 = std::operator<<((ostream *)&std::cerr,"**** baz yielded: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    squall::Coroutine::resume(&co);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** baz result: ");
  iVar2 = squall::Coroutine::result<int>(&co);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  squall::Coroutine::~Coroutine(&co);
  std::__cxx11::string::string((string *)&local_b0,"foo",&local_c9);
  squall::TableBase::co_call<>
            (&co,(TableBase *)
                 vm.super_VM.root_table_._M_t.
                 super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>
                 .super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  while( true ) {
    bVar1 = squall::Coroutine::suspended(&co);
    if (!bVar1) break;
    iVar2 = squall::Coroutine::yielded<int>(&co);
    poVar3 = std::operator<<((ostream *)&std::cerr,"**** foo yielded: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    squall::Coroutine::resume<int>(&co,iVar2 * 2);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** foo result: ");
  iVar2 = squall::Coroutine::result<int>(&co);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  squall::Coroutine::~Coroutine(&co);
  squall::VM::~VM(&vm.super_VM);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("coroutine.nut");

        vm.co_call("bar", 1, 2, 3, 4);

        {
            auto co = vm.co_call("zot");
            while (co.suspended()) {
                co.resume();
            }
            std::cerr << "**** zot result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("baz");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** baz yielded: " << n << std::endl;
                co.resume();
            }
            std::cerr << "**** baz result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("foo");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** foo yielded: " << n << std::endl;
                co.resume(n*2);
            }
            std::cerr << "**** foo result: " << co.result<int>() << std::endl;
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}